

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

uint __thiscall
CVmObjDict::calc_str_hash(CVmObjDict *this,vm_val_t *valstrval,char *valstr,size_t vallen)

{
  int iVar1;
  char *pcVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_val_t *pvVar4;
  uint uVar5;
  vm_obj_id_t vVar6;
  undefined4 uVar7;
  vm_val_t cobj_val;
  vm_rcdesc rc;
  vm_val_t local_68;
  vm_rcdesc local_58;
  
  pvVar4 = sp_;
  pcVar2 = (this->super_CVmObject).ext_;
  iVar1 = *(int *)(pcVar2 + 0x30);
  if (iVar1 == 2) {
    if (valstrval == (vm_val_t *)0x0) {
      sp_ = sp_ + 1;
      vVar6 = CVmObjString::create(0,valstr,vallen);
      pvVar4->typ = VM_OBJ;
      (pvVar4->val).obj = vVar6;
    }
    else {
      uVar7 = *(undefined4 *)&valstrval->field_0x4;
      aVar3 = valstrval->val;
      sp_ = sp_ + 1;
      pvVar4->typ = valstrval->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar7;
      pvVar4->val = aVar3;
    }
    vm_rcdesc::init_ret(&local_58,"HashComparator.calcHash");
    local_68.val.obj = *(undefined4 *)((this->super_CVmObject).ext_ + 0x20);
    local_68.typ = VM_OBJ;
    CVmRun::get_prop(&G_interpreter_X,0,&local_68,G_predef_X.calc_hash_prop,&local_68,1,&local_58);
    uVar7 = r0_.val.obj;
    if (r0_.typ != VM_INT) {
      err_throw(0x900);
    }
  }
  else {
    if (iVar1 == 1) {
      uVar5 = (**(code **)(**(long **)(pcVar2 + 0x28) + 0x1d8))
                        (*(long **)(pcVar2 + 0x28),valstr,vallen);
      return uVar5;
    }
    uVar7 = 0;
    if (iVar1 == 0) {
      uVar5 = CVmHashTable::compute_hash(*(CVmHashTable **)(pcVar2 + 0x10),valstr,vallen);
      return uVar5;
    }
  }
  return uVar7;
}

Assistant:

unsigned int CVmObjDict::calc_str_hash(VMG_ const vm_val_t *valstrval,
                                       const char *valstr, size_t vallen)
{
    vm_val_t result;
    vm_val_t cobj_val;

    /* check what kind of comparator we have */
    switch(get_ext()->comparator_type_)
    {
    case VMDICT_COMP_NONE:
        /* no comparator - use the hash table's basic hash calculation */
        return get_ext()->hashtab_->compute_hash(valstr, vallen);

    case VMDICT_COMP_STRCOMP:
        /* calculate the hash directly with the StringComparator */
        return ((CVmObjStrComp *)get_ext()->comparator_obj_)->calc_str_hash(
            valstr, vallen);

    case VMDICT_COMP_GENERIC:
        /* push the value string */
        if (valstrval != 0)
        {
            /* push the value string as given */
            G_stk->push(valstrval);
        }
        else
        {
            /* no value string was given - create one and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE, valstr, vallen));
        }

        {
            /* set up a recursive call context */
            vm_rcdesc rc;
            rc.init_ret(vmg_ "HashComparator.calcHash");

            /* call the comparator object's calcHash method */
            cobj_val.set_obj(get_ext()->comparator_);
            G_interpreter->get_prop(vmg_ 0, &cobj_val,
                                    G_predef->calc_hash_prop,
                                    &cobj_val, 1, &rc);
        }

        /* get the result from R0 */
        result = *G_interpreter->get_r0();

        /* make sure it's an integer */
        if (result.typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);
            
        /* return the result */
        return (unsigned int)result.val.intval;
    }

    /* we should never get here, but just in case... */
    return 0;
}